

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Geometry2D.cpp
# Opt level: O1

void __thiscall Assimp::X3DImporter::ParseNode_Geometry2D_ArcClose2D(X3DImporter *this)

{
  CX3DImporter_NodeElement *pCVar1;
  size_t *psVar2;
  FIReader *pFVar3;
  char *pcVar4;
  CX3DImporter_NodeElement *pCVar5;
  _func_int **pp_Var6;
  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *plVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  undefined4 extraout_var_00;
  char *__s;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined7 extraout_var;
  _List_node_base *p_Var11;
  int pAttrIdx;
  ulong uVar12;
  string *psVar13;
  CX3DImporter_NodeElement *ne;
  string an;
  string closureType;
  string use;
  string def;
  CX3DImporter_NodeElement *local_d8;
  float local_d0;
  float local_cc;
  float local_c8;
  allocator<char> local_c1;
  X3DImporter *local_c0;
  string local_b8;
  string local_98;
  undefined8 local_78;
  string local_70;
  string local_50;
  undefined4 extraout_var_01;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"PIE","");
  local_d8 = (CX3DImporter_NodeElement *)0x0;
  uVar9 = (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  uVar12 = 0;
  local_c0 = this;
  if ((int)uVar9 < 1) {
    local_d0 = 0.0;
    local_c8 = 1.0;
    local_cc = 1.5707964;
  }
  else {
    local_cc = 1.5707964;
    local_c8 = 1.0;
    local_d0 = 0.0;
    local_78 = 0;
    do {
      pFVar3 = (this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
      pAttrIdx = (int)uVar12;
      iVar10 = (*(pFVar3->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                         (pFVar3,uVar12);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,(char *)CONCAT44(extraout_var_00,iVar10),&local_c1);
      iVar10 = std::__cxx11::string::compare((char *)&local_b8);
      if (iVar10 == 0) {
        iVar10 = (*(((this->mReader)._M_t.
                     super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                     .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                   super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
        __s = (char *)CONCAT44(extraout_var_01,iVar10);
        psVar13 = &local_50;
LAB_006aa710:
        pcVar4 = (char *)psVar13->_M_string_length;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)psVar13,0,pcVar4,(ulong)__s);
        this = local_c0;
      }
      else {
        iVar10 = std::__cxx11::string::compare((char *)&local_b8);
        if (iVar10 == 0) {
          iVar10 = (*(((this->mReader)._M_t.
                       super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                       .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                     super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
          __s = (char *)CONCAT44(extraout_var_02,iVar10);
          psVar13 = &local_70;
          goto LAB_006aa710;
        }
        iVar10 = std::__cxx11::string::compare((char *)&local_b8);
        if (((iVar10 != 0) &&
            (iVar10 = std::__cxx11::string::compare((char *)&local_b8), iVar10 != 0)) &&
           (iVar10 = std::__cxx11::string::compare((char *)&local_b8), iVar10 != 0)) {
          iVar10 = std::__cxx11::string::compare((char *)&local_b8);
          if (iVar10 == 0) {
            iVar10 = (*(((this->mReader)._M_t.
                         super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                         .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                       super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
            __s = (char *)CONCAT44(extraout_var_03,iVar10);
            psVar13 = &local_98;
            goto LAB_006aa710;
          }
          iVar10 = std::__cxx11::string::compare((char *)&local_b8);
          if (iVar10 == 0) {
            local_cc = XML_ReadNode_GetAttrVal_AsFloat(this,pAttrIdx);
          }
          else {
            iVar10 = std::__cxx11::string::compare((char *)&local_b8);
            if (iVar10 == 0) {
              local_c8 = XML_ReadNode_GetAttrVal_AsFloat(this,pAttrIdx);
            }
            else {
              iVar10 = std::__cxx11::string::compare((char *)&local_b8);
              if (iVar10 == 0) {
                bVar8 = XML_ReadNode_GetAttrVal_AsBool(this,pAttrIdx);
                local_78 = CONCAT71(extraout_var,bVar8);
              }
              else {
                iVar10 = std::__cxx11::string::compare((char *)&local_b8);
                if (iVar10 == 0) {
                  local_d0 = XML_ReadNode_GetAttrVal_AsFloat(this,pAttrIdx);
                }
                else {
                  Throw_IncorrectAttr(this,&local_b8);
                }
              }
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      uVar12 = (ulong)(pAttrIdx + 1U);
    } while (uVar9 != pAttrIdx + 1U);
    uVar12 = (ulong)((byte)local_78 & 1);
  }
  if (local_70._M_string_length == 0) {
    local_d8 = (CX3DImporter_NodeElement *)operator_new(0x78);
    pCVar5 = this->NodeElement_Cur;
    local_d8->Type = ENET_ArcClose2D;
    (local_d8->ID)._M_dataplus._M_p = (pointer)&(local_d8->ID).field_2;
    (local_d8->ID)._M_string_length = 0;
    (local_d8->ID).field_2._M_local_buf[0] = '\0';
    local_d8->Parent = pCVar5;
    (local_d8->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_d8->Child;
    (local_d8->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_d8->Child;
    (local_d8->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
    local_d8->_vptr_CX3DImporter_NodeElement =
         (_func_int **)&PTR__CX3DImporter_NodeElement_Geometry2D_008ff818;
    *(CX3DImporter_NodeElement **)&local_d8[1].Type = local_d8 + 1;
    local_d8[1]._vptr_CX3DImporter_NodeElement = (_func_int **)(local_d8 + 1);
    local_d8[1].ID._M_dataplus._M_p = (pointer)0x0;
    local_d8[1].ID.field_2._M_local_buf[0] = '\x01';
    if (local_50._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&local_d8->ID);
    }
    local_d8[1].ID.field_2._M_local_buf[0] = (char)uVar12;
    GeometryHelper_Make_Arc2D
              (this,local_d0,local_cc,local_c8,10,
               (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)(local_d8 + 1));
    pCVar5 = local_d8;
    if (ABS(local_cc - local_d0) < 6.2831855) {
      if ((local_cc != local_d0) || (NAN(local_cc) || NAN(local_d0))) {
        pCVar1 = local_d8 + 1;
        iVar10 = std::__cxx11::string::compare((char *)&local_98);
        if ((iVar10 == 0) ||
           (iVar10 = std::__cxx11::string::compare((char *)&local_98), iVar10 == 0)) {
          p_Var11 = (_List_node_base *)operator_new(0x20);
          p_Var11[1]._M_next = (_List_node_base *)0x0;
          *(undefined4 *)&p_Var11[1]._M_prev = 0;
          std::__detail::_List_node_base::_M_hook(p_Var11);
          psVar13 = &pCVar5[1].ID;
          (psVar13->_M_dataplus)._M_p = (psVar13->_M_dataplus)._M_p + 1;
        }
        else {
          iVar10 = std::__cxx11::string::compare((char *)&local_98);
          if ((iVar10 != 0) &&
             (iVar10 = std::__cxx11::string::compare((char *)&local_98), iVar10 != 0)) {
            local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"closureType","");
            Throw_IncorrectAttrValue(local_c0,&local_b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
          }
        }
        pp_Var6 = pCVar1->_vptr_CX3DImporter_NodeElement;
        p_Var11 = (_List_node_base *)operator_new(0x20);
        *(undefined4 *)&p_Var11[1]._M_prev = *(undefined4 *)(pp_Var6 + 3);
        p_Var11[1]._M_next = (_List_node_base *)pp_Var6[2];
        std::__detail::_List_node_base::_M_hook(p_Var11);
        psVar13 = &pCVar5[1].ID;
        (psVar13->_M_dataplus)._M_p = (psVar13->_M_dataplus)._M_p + 1;
        this = local_c0;
      }
    }
    local_d8[1].ID._M_string_length = (size_type)local_d8[1].ID._M_dataplus._M_p;
    iVar10 = (*(((this->mReader)._M_t.
                 super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                 super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
               super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    pCVar5 = local_d8;
    if ((char)iVar10 == '\0') {
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"ArcClose2D","");
      ParseNode_Metadata(local_c0,pCVar5,&local_b8);
      this = local_c0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        this = local_c0;
      }
    }
    else {
      pCVar5 = this->NodeElement_Cur;
      p_Var11 = (_List_node_base *)operator_new(0x18);
      p_Var11[1]._M_next = (_List_node_base *)local_d8;
      std::__detail::_List_node_base::_M_hook(p_Var11);
      psVar2 = &(pCVar5->Child).
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node._M_size;
      *psVar2 = *psVar2 + 1;
    }
    p_Var11 = (_List_node_base *)operator_new(0x18);
    p_Var11[1]._M_next = (_List_node_base *)local_d8;
    std::__detail::_List_node_base::_M_hook(p_Var11);
    plVar7 = &this->NodeElement_List;
  }
  else {
    XML_CheckNode_MustBeEmpty(this);
    if (local_50._M_string_length != 0) {
      Throw_DEF_And_USE(this);
    }
    bVar8 = FindNodeElement(this,&local_70,ENET_ArcClose2D,&local_d8);
    if (!bVar8) {
      Throw_USE_NotFound(this,&local_70);
    }
    pCVar5 = this->NodeElement_Cur;
    p_Var11 = (_List_node_base *)operator_new(0x18);
    p_Var11[1]._M_next = (_List_node_base *)local_d8;
    std::__detail::_List_node_base::_M_hook(p_Var11);
    plVar7 = &pCVar5->Child;
  }
  psVar2 = &(plVar7->
            super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
            )._M_impl._M_node._M_size;
  *psVar2 = *psVar2 + 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void X3DImporter::ParseNode_Geometry2D_ArcClose2D()
{
    std::string def, use;
    std::string closureType("PIE");
    float endAngle = AI_MATH_HALF_PI_F;
    float radius = 1;
    bool solid = false;
    float startAngle = 0;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("closureType", closureType, mReader->getAttributeValue);
		MACRO_ATTRREAD_CHECK_RET("endAngle", endAngle, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_RET("radius", radius, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_RET("solid", solid, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("startAngle", startAngle, XML_ReadNode_GetAttrVal_AsFloat);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_ArcClose2D, ne);
	}
	else
	{
		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_Geometry2D(CX3DImporter_NodeElement::ENET_ArcClose2D, NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		((CX3DImporter_NodeElement_Geometry2D*)ne)->Solid = solid;
		// create point list of geometry object.
		GeometryHelper_Make_Arc2D(startAngle, endAngle, radius, 10, ((CX3DImporter_NodeElement_Geometry2D*)ne)->Vertices);///TODO: IME - AI_CONFIG for NumSeg
		// add chord or two radiuses only if not a circle was defined
		if(!((std::fabs(endAngle - startAngle) >= AI_MATH_TWO_PI_F) || (endAngle == startAngle)))
		{
			std::list<aiVector3D>& vlist = ((CX3DImporter_NodeElement_Geometry2D*)ne)->Vertices;// just short alias.

			if((closureType == "PIE") || (closureType == "\"PIE\""))
				vlist.push_back(aiVector3D(0, 0, 0));// center point - first radial line
			else if((closureType != "CHORD") && (closureType != "\"CHORD\""))
				Throw_IncorrectAttrValue("closureType");

			vlist.push_back(*vlist.begin());// arc first point - chord from first to last point of arc(if CHORD) or second radial line(if PIE).
		}

		((CX3DImporter_NodeElement_Geometry2D*)ne)->NumIndices = ((CX3DImporter_NodeElement_Geometry2D*)ne)->Vertices.size();
		// check for X3DMetadataObject childs.
		if(!mReader->isEmptyElement())
			ParseNode_Metadata(ne, "ArcClose2D");
		else
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}